

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  curl_sockopt_callback p_Var1;
  SessionHandle *pSVar2;
  long lVar3;
  undefined8 uVar4;
  _Bool _Var5;
  ushort uVar6;
  CURLcode CVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  if2ip_result_t iVar11;
  size_t sVar12;
  uint *puVar13;
  int *piVar14;
  curl_socket_t __fd;
  ulong uVar15;
  char *pcVar16;
  char *fmt;
  socklen_t __len;
  byte *__s;
  int iVar17;
  SessionHandle *unaff_R14;
  ulong uVar18;
  SessionHandle *pSVar19;
  timeval tVar20;
  curl_socket_t sockfd;
  SessionHandle *local_2c0;
  curl_socket_t local_2b4;
  Curl_dns_entry *h;
  uint local_2a8;
  uint local_2a4;
  curl_socket_t *local_2a0;
  SessionHandle *local_298;
  socklen_t local_28c;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char myhost [256];
  
  pSVar19 = conn->data;
  *sockp = -1;
  CVar7 = Curl_socket(conn,ai,&addr,&sockfd);
  if (CVar7 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var5 = getaddressinfo(&addr._sa_ex_u.addr,ipaddress,&port);
  if (!_Var5) {
    puVar13 = (uint *)__errno_location();
    uVar9 = *puVar13;
    pcVar16 = Curl_strerror(conn,uVar9);
    Curl_failf(pSVar19,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar9,pcVar16);
    Curl_closesocket(conn,sockfd);
    return CURLE_OK;
  }
  Curl_infof(pSVar19,"  Trying %s...\n",ipaddress);
  uVar4 = myhost._0_8_;
  __fd = sockfd;
  if ((addr.family == 2) && (addr.socktype == 1)) {
    if ((pSVar19->set).tcp_nodelay == true) {
      unaff_R14 = conn->data;
      myhost[1] = '\0';
      myhost[2] = '\0';
      myhost[3] = '\0';
      myhost[0] = (unaff_R14->set).tcp_nodelay;
      myhost._4_4_ = SUB84(uVar4,4);
      iVar8 = setsockopt(sockfd,6,1,myhost,4);
      if (iVar8 < 0) {
        piVar14 = __errno_location();
        pcVar16 = Curl_strerror(conn,*piVar14);
        Curl_infof(unaff_R14,"Could not set TCP_NODELAY: %s\n",pcVar16);
      }
      else {
        Curl_infof(unaff_R14,"TCP_NODELAY set\n");
      }
    }
    if ((pSVar19->set).tcp_keepalive == true) {
      myhost[0] = '\x01';
      myhost[1] = '\0';
      myhost[2] = '\0';
      myhost[3] = '\0';
      iVar8 = setsockopt(__fd,1,9,myhost,4);
      if (iVar8 < 0) {
        pcVar16 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar8 = curlx_sltosi((pSVar19->set).tcp_keepidle);
        myhost[0] = (char)iVar8;
        myhost[1] = (char)((uint)iVar8 >> 8);
        myhost[2] = (char)((uint)iVar8 >> 0x10);
        myhost[3] = (char)((uint)iVar8 >> 0x18);
        iVar8 = setsockopt(__fd,6,4,myhost,4);
        if (iVar8 < 0) {
          Curl_infof(pSVar19,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)(uint)__fd);
        }
        iVar8 = curlx_sltosi((pSVar19->set).tcp_keepintvl);
        myhost[0] = (char)iVar8;
        myhost[1] = (char)((uint)iVar8 >> 8);
        myhost[2] = (char)((uint)iVar8 >> 0x10);
        myhost[3] = (char)((uint)iVar8 >> 0x18);
        iVar8 = setsockopt(__fd,6,5,myhost,4);
        if (-1 < iVar8) goto LAB_00470712;
        pcVar16 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pSVar19,pcVar16,(ulong)(uint)__fd);
    }
  }
LAB_00470712:
  p_Var1 = (pSVar19->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar8 = (*p_Var1)((pSVar19->set).sockopt_client,__fd,CURLSOCKTYPE_IPCXN), iVar8 == 0)) {
    uVar18 = 0;
  }
  else {
    uVar18 = CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
    if (iVar8 != 2) {
      Curl_closesocket(conn,__fd);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  if (addr.family != 2) goto LAB_00470ae4;
  local_2b4 = __fd;
  uVar9 = Curl_ipv6_scope(&addr._sa_ex_u.addr);
  pSVar2 = conn->data;
  h = (Curl_dns_entry *)0x0;
  uVar6 = (pSVar2->set).localport;
  uVar15 = (ulong)uVar6;
  __s = (byte *)(pSVar2->set).str[5];
  __fd = local_2b4;
  if (uVar6 == 0 && __s == (byte *)0x0) goto LAB_00470ae4;
  iVar8 = (pSVar2->set).localportrange;
  sa.buffer._112_8_ = 0;
  sa.buffer.sa_stor.__ss_align = 0;
  sa.buffer._96_8_ = 0;
  sa.buffer._104_8_ = 0;
  sa.buffer._80_8_ = 0;
  sa.buffer._88_8_ = 0;
  sa.buffer._64_8_ = 0;
  sa.buffer._72_8_ = 0;
  sa.buffer._48_8_ = 0;
  sa.buffer._56_8_ = 0;
  sa.buffer._32_8_ = 0;
  sa.buffer._40_8_ = 0;
  sa.buffer._16_8_ = 0;
  sa.buffer._24_8_ = 0;
  sa.buffer._0_8_ = 0;
  sa.buffer._8_1_ = '\0';
  sa.buffer._9_1_ = '\0';
  sa.buffer._10_1_ = '\0';
  sa.buffer._11_1_ = '\0';
  sa.buffer._12_1_ = '\0';
  sa.buffer._13_1_ = '\0';
  sa.buffer._14_1_ = '\0';
  sa.buffer._15_1_ = '\0';
  local_2a4 = (uint)uVar18;
  local_2c0 = pSVar2;
  local_2a8 = uVar9;
  local_2a0 = sockp;
  local_298 = pSVar19;
  if ((__s == (byte *)0x0) || (sVar12 = strlen((char *)__s), 0xfe < sVar12)) {
LAB_004709fa:
    sa.buffer.sa_in.sin_port = uVar6 << 8 | uVar6 >> 8;
    sa.buffer.sa.sa_family = 2;
    __len = 0x10;
LAB_00470a10:
    while( true ) {
      iVar17 = bind(local_2b4,(sockaddr *)&sa,__len);
      uVar15 = uVar15 & 0xffff;
      if (-1 < iVar17) break;
      if (iVar8 < 2) {
        puVar13 = (uint *)__errno_location();
        pSVar19 = local_2c0;
        uVar9 = *puVar13;
        (local_2c0->state).os_errno = uVar9;
        pcVar16 = Curl_strerror(conn,uVar9);
        fmt = "bind failed with errno %d: %s";
        goto LAB_00470bfa;
      }
      Curl_infof(local_2c0,"Bind to local port %hu failed, trying next\n",uVar15);
      uVar9 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar9;
      if (sa.buffer.sa.sa_family == 2) {
        uVar6 = (ushort)uVar9;
        sa.buffer.sa_in.sin_port = uVar6 << 8 | uVar6 >> 8;
        sa.buffer.sa.sa_family = 2;
      }
      iVar8 = iVar8 + -1;
    }
    local_28c = 0x80;
    myhost[0] = '\0';
    myhost[1] = '\0';
    myhost[2] = '\0';
    myhost[3] = '\0';
    myhost[4] = '\0';
    myhost[5] = '\0';
    myhost[6] = '\0';
    myhost[7] = '\0';
    myhost[8] = '\0';
    myhost[9] = '\0';
    myhost[10] = '\0';
    myhost[0xb] = '\0';
    myhost[0xc] = '\0';
    myhost[0xd] = '\0';
    myhost[0xe] = '\0';
    myhost[0xf] = '\0';
    myhost[0x10] = '\0';
    myhost[0x11] = '\0';
    myhost[0x12] = '\0';
    myhost[0x13] = '\0';
    myhost[0x14] = '\0';
    myhost[0x15] = '\0';
    myhost[0x16] = '\0';
    myhost[0x17] = '\0';
    myhost[0x18] = '\0';
    myhost[0x19] = '\0';
    myhost[0x1a] = '\0';
    myhost[0x1b] = '\0';
    myhost[0x1c] = '\0';
    myhost[0x1d] = '\0';
    myhost[0x1e] = '\0';
    myhost[0x1f] = '\0';
    myhost[0x20] = '\0';
    myhost[0x21] = '\0';
    myhost[0x22] = '\0';
    myhost[0x23] = '\0';
    myhost[0x24] = '\0';
    myhost[0x25] = '\0';
    myhost[0x26] = '\0';
    myhost[0x27] = '\0';
    myhost[0x28] = '\0';
    myhost[0x29] = '\0';
    myhost[0x2a] = '\0';
    myhost[0x2b] = '\0';
    myhost[0x2c] = '\0';
    myhost[0x2d] = '\0';
    myhost[0x2e] = '\0';
    myhost[0x2f] = '\0';
    myhost[0x30] = '\0';
    myhost[0x31] = '\0';
    myhost[0x32] = '\0';
    myhost[0x33] = '\0';
    myhost[0x34] = '\0';
    myhost[0x35] = '\0';
    myhost[0x36] = '\0';
    myhost[0x37] = '\0';
    myhost[0x38] = '\0';
    myhost[0x39] = '\0';
    myhost[0x3a] = '\0';
    myhost[0x3b] = '\0';
    myhost[0x3c] = '\0';
    myhost[0x3d] = '\0';
    myhost[0x3e] = '\0';
    myhost[0x3f] = '\0';
    myhost[0x40] = '\0';
    myhost[0x41] = '\0';
    myhost[0x42] = '\0';
    myhost[0x43] = '\0';
    myhost[0x44] = '\0';
    myhost[0x45] = '\0';
    myhost[0x46] = '\0';
    myhost[0x47] = '\0';
    myhost[0x48] = '\0';
    myhost[0x49] = '\0';
    myhost[0x4a] = '\0';
    myhost[0x4b] = '\0';
    myhost[0x4c] = '\0';
    myhost[0x4d] = '\0';
    myhost[0x4e] = '\0';
    myhost[0x4f] = '\0';
    myhost[0x50] = '\0';
    myhost[0x51] = '\0';
    myhost[0x52] = '\0';
    myhost[0x53] = '\0';
    myhost[0x54] = '\0';
    myhost[0x55] = '\0';
    myhost[0x56] = '\0';
    myhost[0x57] = '\0';
    myhost[0x58] = '\0';
    myhost[0x59] = '\0';
    myhost[0x5a] = '\0';
    myhost[0x5b] = '\0';
    myhost[0x5c] = '\0';
    myhost[0x5d] = '\0';
    myhost[0x5e] = '\0';
    myhost[0x5f] = '\0';
    myhost[0x60] = '\0';
    myhost[0x61] = '\0';
    myhost[0x62] = '\0';
    myhost[99] = '\0';
    myhost[100] = '\0';
    myhost[0x65] = '\0';
    myhost[0x66] = '\0';
    myhost[0x67] = '\0';
    myhost[0x68] = '\0';
    myhost[0x69] = '\0';
    myhost[0x6a] = '\0';
    myhost[0x6b] = '\0';
    myhost[0x6c] = '\0';
    myhost[0x6d] = '\0';
    myhost[0x6e] = '\0';
    myhost[0x6f] = '\0';
    myhost[0x70] = '\0';
    myhost[0x71] = '\0';
    myhost[0x72] = '\0';
    myhost[0x73] = '\0';
    myhost[0x74] = '\0';
    myhost[0x75] = '\0';
    myhost[0x76] = '\0';
    myhost[0x77] = '\0';
    myhost[0x78] = '\0';
    myhost[0x79] = '\0';
    myhost[0x7a] = '\0';
    myhost[0x7b] = '\0';
    myhost[0x7c] = '\0';
    myhost[0x7d] = '\0';
    myhost[0x7e] = '\0';
    myhost[0x7f] = '\0';
    iVar8 = getsockname(local_2b4,(sockaddr *)myhost,&local_28c);
    if (-1 < iVar8) {
      Curl_infof(local_2c0,"Local port: %hu\n",uVar15);
      (conn->bits).bound = true;
      uVar18 = (ulong)local_2a4;
      sockp = local_2a0;
      pSVar19 = local_298;
      __fd = sockfd;
LAB_00470ae4:
      curlx_nonblock(__fd,1);
      tVar20 = curlx_tvnow();
      conn->connecttime = tVar20;
      if (1 < conn->num_addr) {
        Curl_expire_latest(pSVar19,conn->timeoutms_per_addr);
      }
      if (((char)uVar18 == '\0') && (conn->socktype == 1)) {
        iVar8 = connect(__fd,(sockaddr *)&addr._sa_ex_u.addr,addr.addrlen);
        if (iVar8 == -1) {
          piVar14 = __errno_location();
          iVar8 = *piVar14;
          if ((iVar8 != 0xb) && (iVar8 != 0x73)) {
            pcVar16 = Curl_strerror(conn,iVar8);
            Curl_infof(pSVar19,"Immediate connect fail for %s: %s\n",ipaddress,pcVar16);
            (pSVar19->state).os_errno = iVar8;
            Curl_closesocket(conn,__fd);
            return CURLE_COULDNT_CONNECT;
          }
        }
        *sockp = __fd;
      }
      else {
        *sockp = __fd;
      }
      return CURLE_OK;
    }
    puVar13 = (uint *)__errno_location();
    pSVar19 = local_2c0;
    uVar9 = *puVar13;
    (local_2c0->state).os_errno = uVar9;
    pcVar16 = Curl_strerror(conn,uVar9);
    fmt = "getsockname() failed with errno %d: %s";
LAB_00470bfa:
    Curl_failf(pSVar19,fmt,(ulong)uVar9,pcVar16);
  }
  else {
    memset(myhost,0,0x100);
    iVar17 = *__s - 0x69;
    if ((iVar17 == 0) && (iVar17 = __s[1] - 0x66, iVar17 == 0)) {
      iVar17 = 0x21 - (uint)__s[2];
    }
    else {
      iVar17 = -iVar17;
    }
    if (iVar17 != 0) {
      iVar10 = strncmp("host!",(char *)__s,5);
      if (iVar10 != 0) goto LAB_0047087c;
      __s = __s + 5;
      goto LAB_00470953;
    }
    __s = __s + 3;
LAB_0047087c:
    iVar11 = Curl_if2ip(2,local_2a8,conn->scope_id,(char *)__s,myhost,0x100);
    if (iVar11 == IF2IP_FOUND) {
      Curl_infof(local_2c0,"Local Interface %s is ip %s using address family %i\n",__s,myhost,2);
      sVar12 = strlen((char *)__s);
      iVar17 = setsockopt(local_2b4,1,0x19,__s,(int)sVar12 + 1);
      if (iVar17 != 0) {
        puVar13 = (uint *)__errno_location();
        uVar9 = *puVar13;
        pcVar16 = Curl_strerror(conn,uVar9);
        Curl_infof(local_2c0,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",
                   __s,(ulong)uVar9,pcVar16);
      }
LAB_004709dd:
      iVar17 = inet_pton(2,myhost,(void *)((long)&sa.buffer + 4));
      if (0 < iVar17) goto LAB_004709fa;
      __len = 0;
      goto LAB_00470a10;
    }
    if (iVar11 == IF2IP_AF_NOT_SUPPORTED) goto LAB_00470c0d;
    if (iVar11 == IF2IP_NOT_FOUND) {
      if (iVar17 != 0) {
LAB_00470953:
        lVar3 = conn->ip_version;
        conn->ip_version = 1;
        Curl_resolv(conn,(char *)__s,0,&h);
        conn->ip_version = lVar3;
        if (h != (Curl_dns_entry *)0x0) {
          Curl_printable_address(h->addr,myhost,0x100);
          pSVar19 = local_2c0;
          Curl_infof(local_2c0,"Name \'%s\' family %i resolved to \'%s\' family %i\n",__s,2,myhost,
                     (ulong)(uint)h->addr->ai_family);
          Curl_resolv_unlock(pSVar19,h);
          goto LAB_004709dd;
        }
        goto LAB_00470c29;
      }
      pcVar16 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if (iVar17 != 0) goto LAB_00470953;
LAB_00470c29:
      pcVar16 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(local_2c0,pcVar16,__s);
  }
  iVar11 = 0x2d;
LAB_00470c0d:
  Curl_closesocket(conn,sockfd);
  if (iVar11 == IF2IP_AF_NOT_SUPPORTED) {
    return CURLE_COULDNT_CONNECT;
  }
  return iVar11;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}